

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void compact_float64_suite::test_array32_float64_two(void)

{
  view_type *pvVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  undefined4 local_94;
  value local_90 [2];
  undefined8 local_88;
  value_type expected [16];
  value local_70 [2];
  undefined4 local_68;
  value local_64 [2];
  undefined4 local_5c;
  value local_58 [2];
  undefined1 local_50 [8];
  decoder decoder;
  value_type input [21];
  
  decoder.current.view._M_str = (uchar *)0x10cf;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[21]>
            ((decoder *)local_50,(uchar (*) [21])&decoder.current.view._M_str);
  local_58[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_50);
  local_5c = 0xcf;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array32_float64",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xffe,"void compact_float64_suite::test_array32_float64_two()",local_58,&local_5c);
  local_64[0] = trial::protocol::bintoken::detail::decoder::symbol((decoder *)local_50);
  local_68 = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xfff,"void compact_float64_suite::test_array32_float64_two()",local_64,&local_68);
  local_70[0] = trial::protocol::bintoken::detail::decoder::category((decoder *)local_50);
  expected[0xc] = '\x02';
  expected[0xd] = '\0';
  expected[0xe] = '\0';
  expected[0xf] = '\0';
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x1000,"void compact_float64_suite::test_array32_float64_two()",local_70,
             expected + 0xc);
  local_88 = 0x3ff0000000000000;
  expected[0] = '\0';
  expected[1] = '\0';
  expected[2] = '\0';
  expected[3] = '\0';
  expected[4] = '\0';
  expected[5] = '\0';
  expected[6] = 0xf0;
  expected[7] = '?';
  pvVar1 = trial::protocol::bintoken::detail::decoder::literal((decoder *)local_50);
  pvVar2 = std::
           basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
           ::begin(pvVar1);
  pvVar1 = trial::protocol::bintoken::detail::decoder::literal((decoder *)local_50);
  pvVar3 = std::
           basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
           ::end(pvVar1);
  boost::detail::
  test_all_with_impl<std::ostream,unsigned_char_const*,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x1007,"void compact_float64_suite::test_array32_float64_two()",pvVar2,pvVar3,
             &local_88,expected + 8);
  trial::protocol::bintoken::detail::decoder::next((decoder *)local_50);
  local_90[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_50);
  local_94 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x1009,"void compact_float64_suite::test_array32_float64_two()",local_90,&local_94);
  return;
}

Assistant:

void test_array32_float64_two()
{
    const value_type input[] = { token::code::array32_float64, 0x10, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xF0, 0x3F, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xF0, 0x3F };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array32_float64);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    const value_type expected[] = {
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xF0, 0x3F,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xF0, 0x3F
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(decoder.literal().begin(), decoder.literal().end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}